

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_ln.c
# Opt level: O1

cmd_ln_t * cmd_ln_parse_file_r(cmd_ln_t *inout_cmdln,arg_t *defn,char *filename,int32 strict)

{
  int iVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  FILE *__stream;
  char *pcVar6;
  char **argv;
  char **ppcVar7;
  cmd_ln_t *pcVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  uint argc;
  bool bVar12;
  char separator [5];
  int local_74;
  long local_70;
  char *local_68;
  undefined4 local_58;
  undefined1 local_54;
  ulong local_50;
  int32 local_48;
  uint local_44;
  cmd_ln_t *local_40;
  arg_t *local_38;
  
  local_54 = 0;
  local_58 = 0xa0d0920;
  __stream = fopen(filename,"r");
  if (__stream == (FILE *)0x0) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
            ,0x30a,"Cannot open configuration file %s for reading\n",filename);
    return (cmd_ln_t *)0x0;
  }
  iVar4 = fgetc(__stream);
  if (iVar4 != -1) {
    do {
      pcVar6 = strchr((char *)&local_58,iVar4);
      if (pcVar6 == (char *)0x0) {
        local_40 = inout_cmdln;
        local_38 = defn;
        argv = (char **)__ckd_calloc__(0x1e,8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                       ,0x31c);
        local_68 = (char *)__ckd_calloc__(0x201,1,
                                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                          ,0x31e);
        local_50 = 0x200;
        iVar1 = 0x1e;
        argc = 0;
        local_74 = 0;
        bVar3 = false;
        goto LAB_0010734f;
      }
      iVar4 = fgetc(__stream);
    } while (iVar4 != -1);
  }
  fclose(__stream);
  return (cmd_ln_t *)0x0;
LAB_0010734f:
  local_44 = argc & 1;
  local_70 = 0;
  uVar10 = local_50;
  do {
    iVar5 = (int)local_70;
    if (iVar5 == 0 && local_44 == 0) {
LAB_00107376:
      if (iVar4 == 0x23) {
        do {
          iVar4 = fgetc(__stream);
          if (iVar4 == 10) break;
        } while (iVar4 != -1);
        do {
          iVar4 = fgetc(__stream);
          if (iVar4 == -1) break;
          pcVar6 = strchr((char *)&local_58,iVar4);
        } while (pcVar6 != (char *)0x0);
        goto LAB_00107376;
      }
      if (iVar4 == -1) goto LAB_001075ee;
    }
    if ((iVar4 == 0x22) || (iVar4 == 0x27)) {
      if (local_74 == iVar4) {
        local_74 = 0;
      }
      else {
        bVar12 = local_74 != 0;
        local_74 = iVar4;
        if (bVar12) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                  ,0x335,"Nesting quotations is not supported!\n");
          bVar3 = true;
          goto LAB_001075ee;
        }
      }
    }
    else {
      if ((iVar4 == -1) ||
         ((local_74 == 0 && (pcVar6 = strchr((char *)&local_58,iVar4), pcVar6 != (char *)0x0))))
      break;
      iVar11 = (int)uVar10;
      if (iVar11 <= iVar5) {
        local_50 = uVar10;
        local_48 = strict;
        pcVar6 = (char *)__ckd_realloc__(local_68,(long)(iVar11 * 2 + 1),
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                         ,0x35f);
        bVar12 = pcVar6 == (char *)0x0;
        if (bVar12) {
          pcVar6 = local_68;
        }
        uVar2 = iVar11 * 2;
        if (bVar12) {
          bVar3 = true;
          uVar2 = (uint)local_50;
        }
        uVar10 = (ulong)uVar2;
        local_68 = pcVar6;
        strict = local_48;
        if (bVar12) goto LAB_001075ee;
      }
      lVar9 = (long)iVar5;
      local_70 = lVar9 + 1;
      local_68[lVar9] = (char)iVar4;
      local_68[lVar9 + 1] = '\0';
    }
    iVar4 = fgetc(__stream);
  } while( true );
  ppcVar7 = argv;
  local_50 = uVar10;
  if (iVar1 <= (int)argc) {
    iVar1 = iVar1 * 2;
    ppcVar7 = (char **)__ckd_realloc__(argv,(long)iVar1 * 8,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                                       ,0x341);
    if (ppcVar7 == (char **)0x0) {
      bVar3 = true;
LAB_001075ee:
      fclose(__stream);
      ckd_free(local_68);
      if (bVar3) {
        if (0 < (int)argc) {
          uVar10 = 0;
          do {
            ckd_free(argv[uVar10]);
            uVar10 = uVar10 + 1;
          } while (argc != uVar10);
        }
        ckd_free(argv);
        return (cmd_ln_t *)0x0;
      }
      pcVar8 = parse_options(local_40,local_38,argc,argv,strict);
      return pcVar8;
    }
  }
  pcVar6 = __ckd_salloc__(local_68,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
                          ,0x34a);
  ppcVar7[argc] = pcVar6;
  *local_68 = '\0';
  if (local_74 != 0) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/cmd_ln.c"
            ,0x350,"Unclosed quotation, having EOF close it...\n");
  }
  argc = argc + 1;
  while( true ) {
    argv = ppcVar7;
    if (iVar4 == -1) goto LAB_001075ee;
    pcVar6 = strchr((char *)&local_58,iVar4);
    if (pcVar6 == (char *)0x0) break;
    iVar4 = fgetc(__stream);
  }
  goto LAB_0010734f;
}

Assistant:

cmd_ln_t *
cmd_ln_parse_file_r(cmd_ln_t *inout_cmdln, const arg_t * defn, const char *filename, int32 strict)
{
    FILE *file;
    int argc;
    int argv_size;
    char *str;
    int arg_max_length = 512;
    int len = 0;
    int quoting, ch;
    char **f_argv;
    int rv = 0;
    const char separator[] = " \t\r\n";

    if ((file = fopen(filename, "r")) == NULL) {
        E_ERROR("Cannot open configuration file %s for reading\n",
                filename);
        return NULL;
    }

    ch = fgetc(file);
    /* Skip to the next interesting character */
    for (; ch != EOF && strchr(separator, ch); ch = fgetc(file)) ;

    if (ch == EOF) {
        fclose(file);
        return NULL;
    }

    /*
     * Initialize default argv, argc, and argv_size.
     */
    argv_size = 30;
    argc = 0;
    f_argv = (char **)ckd_calloc(argv_size, sizeof(char *));
    /* Silently make room for \0 */
    str = (char* )ckd_calloc(arg_max_length + 1, sizeof(char));
    quoting = 0;

    do {
        /* Handle arguments that are commented out */
        if (len == 0 && argc % 2 == 0) {
            while (ch == '#') {
                /* Skip everything until newline */
                for (ch = fgetc(file); ch != EOF && ch != '\n'; ch = fgetc(file)) ;
                /* Skip to the next interesting character */
                for (ch = fgetc(file); ch != EOF && strchr(separator, ch); ch = fgetc(file)) ;
            }

            /* Check if we are at the last line (without anything interesting in it) */
            if (ch == EOF)
                break;
        }

        /* Handle quoted arguments */
        if (ch == '"' || ch == '\'') {
            if (quoting == ch) /* End a quoted section with the same type */
                quoting = 0;
            else if (quoting) {
                E_ERROR("Nesting quotations is not supported!\n");
                rv = 1;
                break;
            }
            else
                quoting = ch; /* Start a quoted section */
        }
        else if (ch == EOF || (!quoting && strchr(separator, ch))) {
            /* Reallocate argv so it is big enough to contain all the arguments */
            if (argc >= argv_size) {
                char **tmp_argv;
                if (!(tmp_argv =
                       (char **)ckd_realloc(f_argv, argv_size * 2 * sizeof(char *)))) {
                    rv = 1;
                    break;
                }
                f_argv = tmp_argv;
                argv_size *= 2;
            }

            /* Add the string to the list of arguments */
            f_argv[argc] = ckd_salloc(str);
            len = 0;
            str[0] = '\0';
            argc++;

            if (quoting)
                E_WARN("Unclosed quotation, having EOF close it...\n");

            /* Skip to the next interesting character */
            for (; ch != EOF && strchr(separator, ch); ch = fgetc(file)) ;

            if (ch == EOF)
                break;

            /* We already have the next character */
            continue;
        }
        else {
            if (len >= arg_max_length) {
                /* Make room for more chars (including the \0 !) */
                char *tmp_str = str;
                if ((tmp_str = (char *)ckd_realloc(str, (1 + arg_max_length * 2) * sizeof(char))) == NULL) {
                    rv = 1;
                    break;
                }
                str = tmp_str;
                arg_max_length *= 2;
            }
            /* Add the char to the argument string */
            str[len++] = ch;
            /* Always null terminate */
            str[len] = '\0';
        }

        ch = fgetc(file);
    } while (1);

    fclose(file);

    ckd_free(str);

    if (rv) {
        for (ch = 0; ch < argc; ++ch)
            ckd_free(f_argv[ch]);
        ckd_free(f_argv);
        return NULL;
    }

    return parse_options(inout_cmdln, defn, argc, f_argv, strict);
}